

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O3

bool hasAttribute(xmlNodePtr node,xmlChar *name)

{
  int iVar1;
  _xmlAttr *p_Var2;
  bool bVar3;
  
  p_Var2 = node->properties;
  if (p_Var2 == (_xmlAttr *)0x0) {
    bVar3 = false;
  }
  else {
    do {
      iVar1 = xmlStrEqual(p_Var2->name,"time");
      bVar3 = iVar1 != 0;
      if (bVar3) {
        return bVar3;
      }
      p_Var2 = p_Var2->next;
    } while (p_Var2 != (_xmlAttr *)0x0);
  }
  return bVar3;
}

Assistant:

static bool hasAttribute(xmlNodePtr node, const xmlChar* name) {
    xmlAttr *attr = node->properties;
    while (attr) {
        if (xmlStrEqual(attr->name, name)) {
            return true;
        }
        attr = attr->next;
    }

    return false;
}